

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O0

Stats * Enhedron::Test::Impl::Impl_Suite::Register::run
                  (Stats *__return_storage_ptr__,PathList *pathList,
                  Out<Enhedron::Test::Impl::Impl_Results::Results> results)

{
  Stats rhs;
  pointer pbVar1;
  bool bVar2;
  Register *this;
  pointer pCVar3;
  Out<Enhedron::Test::Impl::Impl_Suite::ContextResultsRecorder> OVar4;
  Results *pRVar5;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  uint64_t local_70;
  reference local_68;
  unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
  *context;
  iterator __end3;
  iterator __begin3;
  ContextList *__range3;
  undefined1 local_40 [8];
  ContextResultsRecorder resultsRecorder;
  PathList *pathList_local;
  Out<Enhedron::Test::Impl::Impl_Results::Results> results_local;
  
  resultsRecorder.contextStack_.stack_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pathList;
  pathList_local = (PathList *)results.value;
  Impl_Results::Stats::Stats(__return_storage_ptr__);
  ContextResultsRecorder::ContextResultsRecorder
            ((ContextResultsRecorder *)local_40,
             (Out<Enhedron::Test::Impl::Impl_Results::Results>)pathList_local);
  this = instance();
  __end3 = std::
           vector<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
           ::begin(&this->contextList);
  context = (unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
             *)std::
               vector<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
               ::end(&this->contextList);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_*,_std::vector<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>_>
                                *)&context);
    if (!bVar2) break;
    local_68 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_*,_std::vector<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>_>
               ::operator*(&__end3);
    pCVar3 = std::
             unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
             ::operator->(local_68);
    pbVar1 = resultsRecorder.contextStack_.stack_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    OVar4 = Enhedron::Impl::Util::out<Enhedron::Test::Impl::Impl_Suite::ContextResultsRecorder>
                      ((ContextResultsRecorder *)local_40);
    (*pCVar3->_vptr_Context[3])(&local_90,pCVar3,pbVar1,OVar4.value,0);
    rhs.tests_ = uStack_88;
    rhs.fixtures_ = local_90;
    rhs.checks_ = local_80;
    rhs.failedTests_ = uStack_78;
    rhs.failedChecks_ = local_70;
    Impl_Results::Stats::operator+=(__return_storage_ptr__,rhs);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_*,_std::vector<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>_>
    ::operator++(&__end3);
  }
  pRVar5 = Enhedron::Impl::Util::Out<Enhedron::Test::Impl::Impl_Results::Results>::operator->
                     ((Out<Enhedron::Test::Impl::Impl_Results::Results> *)&pathList_local);
  (*pRVar5->_vptr_Results[2])(pRVar5,__return_storage_ptr__);
  ContextResultsRecorder::~ContextResultsRecorder((ContextResultsRecorder *)local_40);
  return __return_storage_ptr__;
}

Assistant:

static Stats run(const PathList& pathList, Out<Results> results) {
            Stats stats;

            ContextResultsRecorder resultsRecorder(results);

            for (const auto& context : instance().contextList) {
                stats += context->run(pathList, out(resultsRecorder), 0);
            }

            results->finish(stats);
            return stats;
        }